

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::ErrorResponse>::construct(BasicTypeInfo<dap::ErrorResponse> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::ErrorResponse> *this_local;
  
  memset(ptr,0,200);
  ErrorResponse::ErrorResponse((ErrorResponse *)ptr);
  return;
}

Assistant:

inline void construct(void* ptr) const override { new (ptr) T(); }